

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O0

void __thiscall flow::TargetCodeGenerator::generate(TargetCodeGenerator *this,IRHandler *handler)

{
  mapped_type mVar1;
  bool bVar2;
  size_t sVar3;
  element_type *peVar4;
  reference __k;
  reference pCVar5;
  reference __k_00;
  reference pUVar6;
  Instruction IVar7;
  reference pvVar8;
  const_reference pvVar9;
  mapped_type *pmVar10;
  reference pvVar11;
  BasicBlock *pBVar12;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *ppVar13;
  UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
  UVar14;
  BasicBlock *local_1c0;
  size_type local_1b8;
  size_t e;
  size_t i;
  MatchDef *def;
  vector<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
  *local_188;
  vector<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
  *cases;
  MatchInstr *matchInstr;
  size_t matchId;
  pair<flow::MatchInstr_*,_unsigned_long> *hint;
  iterator __end1_3;
  iterator __begin1_3;
  list<std::pair<flow::MatchInstr_*,_unsigned_long>,_std::allocator<std::pair<flow::MatchInstr_*,_unsigned_long>_>_>
  *__range1_3;
  UnconditionalJump *source_1;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>
  *__range2_2;
  size_t targetPC_1;
  pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>_>
  *target_1;
  iterator __end1_2;
  iterator __begin1_2;
  unordered_map<flow::BasicBlock_*,_std::__cxx11::list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>_>_>_>
  *__range1_2;
  ConditionalJump *source;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>
  *__range2_1;
  size_t targetPC;
  pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>_>
  *target;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_map<flow::BasicBlock_*,_std::__cxx11::list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>_>_>_>
  *__range1_1;
  Instr *instr;
  iterator __end2;
  iterator __begin2;
  UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
  *__range2;
  BasicBlock *bb;
  iterator __end1;
  iterator __begin1;
  UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
  local_68;
  UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
  *local_58;
  UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
  *__range1;
  unordered_map<flow::BasicBlock_*,_unsigned_long,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>_>
  basicBlockEntryPoints;
  IRHandler *handler_local;
  TargetCodeGenerator *this_local;
  
  basicBlockEntryPoints._M_h._M_single_bucket = (__node_base_ptr)handler;
  sVar3 = ConstantPool::makeHandler(&this->cp_,handler);
  this->handlerId_ = sVar3;
  std::
  unordered_map<flow::BasicBlock_*,_unsigned_long,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>_>
  ::unordered_map((unordered_map<flow::BasicBlock_*,_unsigned_long,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>_>
                   *)&__range1);
  local_68 = IRHandler::basicBlocks_abi_cxx11_
                       ((IRHandler *)basicBlockEntryPoints._M_h._M_single_bucket);
  local_58 = &local_68;
  __end1 = util::
           UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
           ::begin(local_58);
  bb = (BasicBlock *)
       util::
       UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
       ::end(local_58);
  while( true ) {
    bVar2 = util::
            UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
            ::iterator::operator!=(&__end1,(iterator *)&bb);
    if (!bVar2) break;
    __range2 = (UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                *)util::
                  UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
                  ::iterator::operator*(&__end1);
    sVar3 = getInstructionPointer(this);
    pmVar10 = std::
              unordered_map<flow::BasicBlock_*,_unsigned_long,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>_>
              ::operator[]((unordered_map<flow::BasicBlock_*,_unsigned_long,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>_>
                            *)&__range1,(key_type *)&__range2);
    *pmVar10 = sVar3;
    UVar14 = BasicBlock::instructions((BasicBlock *)__range2);
    __begin2 = UVar14.begin_.it_._M_current;
    __end2 = util::
             UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
             ::begin((UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                      *)&__begin2);
    instr = (Instr *)util::
                     UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                     ::end((UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                            *)&__begin2);
    while( true ) {
      bVar2 = util::
              UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
              ::iterator::operator!=(&__end2,(iterator *)&instr);
      if (!bVar2) break;
      peVar4 = util::
               UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
               ::iterator::operator*(&__end2);
      (*(peVar4->super_Value)._vptr_Value[4])(peVar4,this);
      util::
      UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
      ::iterator::operator++(&__end2);
    }
    util::
    UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
    ::iterator::operator++(&__end1);
  }
  __end1_1 = std::
             unordered_map<flow::BasicBlock_*,_std::__cxx11::list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>_>_>_>
             ::begin(&this->conditionalJumps_);
  target = (pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>_>
            *)std::
              unordered_map<flow::BasicBlock_*,_std::__cxx11::list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>_>_>_>
              ::end(&this->conditionalJumps_);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end1_1.
                        super__Node_iterator_base<std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>_>,_false>
                         *)&target);
    if (!bVar2) break;
    __k = std::__detail::
          _Node_iterator<std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>_>,_false,_false>
          ::operator*(&__end1_1);
    pmVar10 = std::
              unordered_map<flow::BasicBlock_*,_unsigned_long,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>_>
              ::operator[]((unordered_map<flow::BasicBlock_*,_unsigned_long,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>_>
                            *)&__range1,&__k->first);
    mVar1 = *pmVar10;
    __end2_1 = std::__cxx11::
               list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>
               ::begin(&__k->second);
    source = (ConditionalJump *)
             std::__cxx11::
             list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>
             ::end(&__k->second);
    while( true ) {
      bVar2 = std::operator!=(&__end2_1,(_Self *)&source);
      if (!bVar2) break;
      pCVar5 = std::_List_const_iterator<flow::TargetCodeGenerator::ConditionalJump>::operator*
                         (&__end2_1);
      __range2_1._0_2_ = (Operand)mVar1;
      IVar7 = makeInstruction(pCVar5->opcode,(Operand)__range2_1);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->code_,pCVar5->pc);
      *pvVar8 = IVar7;
      std::_List_const_iterator<flow::TargetCodeGenerator::ConditionalJump>::operator++(&__end2_1);
    }
    std::__detail::
    _Node_iterator<std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>_>,_false,_false>
    ::operator++(&__end1_1);
  }
  std::
  unordered_map<flow::BasicBlock_*,_std::__cxx11::list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>_>_>_>
  ::clear(&this->conditionalJumps_);
  __end1_2 = std::
             unordered_map<flow::BasicBlock_*,_std::__cxx11::list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>_>_>_>
             ::begin(&this->unconditionalJumps_);
  target_1 = (pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>_>
              *)std::
                unordered_map<flow::BasicBlock_*,_std::__cxx11::list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>_>_>_>
                ::end(&this->unconditionalJumps_);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end1_2.
                        super__Node_iterator_base<std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>_>,_false>
                         *)&target_1);
    if (!bVar2) break;
    __k_00 = std::__detail::
             _Node_iterator<std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>_>,_false,_false>
             ::operator*(&__end1_2);
    pmVar10 = std::
              unordered_map<flow::BasicBlock_*,_unsigned_long,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>_>
              ::operator[]((unordered_map<flow::BasicBlock_*,_unsigned_long,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>_>
                            *)&__range1,&__k_00->first);
    mVar1 = *pmVar10;
    __end2_2 = std::__cxx11::
               list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>
               ::begin(&__k_00->second);
    source_1 = (UnconditionalJump *)
               std::__cxx11::
               list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>
               ::end(&__k_00->second);
    while( true ) {
      bVar2 = std::operator!=(&__end2_2,(_Self *)&source_1);
      if (!bVar2) break;
      pUVar6 = std::_List_const_iterator<flow::TargetCodeGenerator::UnconditionalJump>::operator*
                         (&__end2_2);
      __range2_2._0_2_ = (Operand)mVar1;
      IVar7 = makeInstruction(pUVar6->opcode,(Operand)__range2_2);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->code_,pUVar6->pc);
      *pvVar8 = IVar7;
      std::_List_const_iterator<flow::TargetCodeGenerator::UnconditionalJump>::operator++(&__end2_2)
      ;
    }
    std::__detail::
    _Node_iterator<std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>_>,_false,_false>
    ::operator++(&__end1_2);
  }
  std::
  unordered_map<flow::BasicBlock_*,_std::__cxx11::list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>_>_>_>
  ::clear(&this->unconditionalJumps_);
  __end1_3 = std::__cxx11::
             list<std::pair<flow::MatchInstr_*,_unsigned_long>,_std::allocator<std::pair<flow::MatchInstr_*,_unsigned_long>_>_>
             ::begin(&this->matchHints_);
  hint = (pair<flow::MatchInstr_*,_unsigned_long> *)
         std::__cxx11::
         list<std::pair<flow::MatchInstr_*,_unsigned_long>,_std::allocator<std::pair<flow::MatchInstr_*,_unsigned_long>_>_>
         ::end(&this->matchHints_);
  while( true ) {
    bVar2 = std::operator!=(&__end1_3,(_Self *)&hint);
    if (!bVar2) break;
    matchId = (size_t)std::_List_iterator<std::pair<flow::MatchInstr_*,_unsigned_long>_>::operator*
                                (&__end1_3);
    matchInstr = (MatchInstr *)((reference)matchId)->second;
    cases = (vector<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
             *)((reference)matchId)->first;
    MatchInstr::cases((vector<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
                       *)&def,(MatchInstr *)cases);
    local_188 = (vector<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
                 *)&def;
    i = (size_t)ConstantPool::getMatchDef(&this->cp_,(size_t)matchInstr);
    e = 0;
    local_1b8 = std::
                vector<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
                ::size(local_188);
    for (; e != local_1b8; e = e + 1) {
      pvVar9 = std::
               vector<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
               ::operator[](local_188,e);
      pmVar10 = std::
                unordered_map<flow::BasicBlock_*,_unsigned_long,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>_>
                ::operator[]((unordered_map<flow::BasicBlock_*,_unsigned_long,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>_>
                              *)&__range1,&pvVar9->second);
      mVar1 = *pmVar10;
      pvVar11 = std::vector<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>::operator[]
                          ((vector<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_> *)
                           (i + 0x18),e);
      pvVar11->pc = mVar1;
    }
    pBVar12 = MatchInstr::elseBlock((MatchInstr *)cases);
    if (pBVar12 != (BasicBlock *)0x0) {
      local_1c0 = MatchInstr::elseBlock((MatchInstr *)cases);
      pmVar10 = std::
                unordered_map<flow::BasicBlock_*,_unsigned_long,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>_>
                ::operator[]((unordered_map<flow::BasicBlock_*,_unsigned_long,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>_>
                              *)&__range1,&local_1c0);
      *(mapped_type *)(i + 0x10) = *pmVar10;
    }
    std::
    vector<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
    ::~vector((vector<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
               *)&def);
    std::_List_iterator<std::pair<flow::MatchInstr_*,_unsigned_long>_>::operator++(&__end1_3);
  }
  std::__cxx11::
  list<std::pair<flow::MatchInstr_*,_unsigned_long>,_std::allocator<std::pair<flow::MatchInstr_*,_unsigned_long>_>_>
  ::clear(&this->matchHints_);
  ppVar13 = ConstantPool::getHandler_abi_cxx11_(&this->cp_,this->handlerId_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&ppVar13->second,&this->code_);
  std::deque<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>::clear(&this->stack_);
  std::
  unordered_map<flow::BasicBlock_*,_unsigned_long,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>_>
  ::~unordered_map((unordered_map<flow::BasicBlock_*,_unsigned_long,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>_>
                    *)&__range1);
  return;
}

Assistant:

void TargetCodeGenerator::generate(IRHandler* handler) {
  // explicitely forward-declare handler, so we can use its ID internally.
  handlerId_ = cp_.makeHandler(handler);

  std::unordered_map<BasicBlock*, size_t> basicBlockEntryPoints;

  // generate code for all basic blocks, sequentially
  for (BasicBlock* bb : handler->basicBlocks()) {
    basicBlockEntryPoints[bb] = getInstructionPointer();
    for (Instr* instr : bb->instructions()) {
      instr->accept(*this);
    }
  }

  // fixiate conditional jump instructions
  for (const auto& target : conditionalJumps_) {
    size_t targetPC = basicBlockEntryPoints[target.first];
    for (const auto& source : target.second) {
      code_[source.pc] = makeInstruction(source.opcode, targetPC);
    }
  }
  conditionalJumps_.clear();

  // fixiate unconditional jump instructions
  for (const auto& target : unconditionalJumps_) {
    size_t targetPC = basicBlockEntryPoints[target.first];
    for (const auto& source : target.second) {
      code_[source.pc] = makeInstruction(source.opcode, targetPC);
    }
  }
  unconditionalJumps_.clear();

  // fixiate match jump table
  for (const auto& hint : matchHints_) {
    size_t matchId = hint.second;
    MatchInstr* matchInstr = hint.first;
    const auto& cases = matchInstr->cases();
    MatchDef& def = cp_.getMatchDef(matchId);

    for (size_t i = 0, e = cases.size(); i != e; ++i) {
      def.cases[i].pc = basicBlockEntryPoints[cases[i].second];
    }

    if (matchInstr->elseBlock()) {
      def.elsePC = basicBlockEntryPoints[matchInstr->elseBlock()];
    }
  }
  matchHints_.clear();

  cp_.getHandler(handlerId_).second = std::move(code_);

  // cleanup remaining handler-local work vars
  //FLOW_TRACE("flow: stack depth after handler code generation: {}", stack_.size());
  stack_.clear();
}